

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O2

BLOB_RESULT
Blob_PutBlockList(HTTPAPIEX_HANDLE httpApiExHandle,char *relativePath,
                 SINGLYLINKEDLIST_HANDLE blockIDList,uint *httpStatus,BUFFER_HANDLE httpResponse)

{
  undefined4 in_EAX;
  int iVar1;
  HTTPAPIEX_RESULT HVar2;
  LOGGER_LOG p_Var3;
  LIST_ITEM_HANDLE pLVar4;
  STRING_HANDLE handle;
  STRING_HANDLE pSVar5;
  uchar *source;
  size_t size;
  BUFFER_HANDLE requestContent;
  BLOB_RESULT BVar6;
  char *pcVar7;
  uint *puVar8;
  undefined1 auVar9 [16];
  uint httpResponseStatusCode;
  uint *local_40;
  BUFFER_HANDLE local_38;
  
  auVar9._0_4_ = -(uint)(httpApiExHandle == (HTTPAPIEX_HANDLE)0x0);
  auVar9._4_4_ = -(uint)(relativePath == (char *)0x0);
  auVar9._8_4_ = -(uint)(blockIDList == (SINGLYLINKEDLIST_HANDLE)0x0);
  auVar9._12_4_ = -(uint)(httpStatus == (uint *)0x0);
  iVar1 = movmskps(in_EAX,auVar9);
  if (iVar1 != 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"Blob_PutBlockList",0x112,1,
                "Invalid argument (httpApiExHandle=%p, relativePath=%p, blockIDList=%p, httpStatus=%p)"
                ,httpApiExHandle,relativePath,blockIDList,httpStatus);
      return BLOB_INVALID_ARG;
    }
    return BLOB_INVALID_ARG;
  }
  pLVar4 = singlylinkedlist_get_head_item(blockIDList);
  if (pLVar4 == (LIST_ITEM_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return BLOB_ERROR;
    }
    pcVar7 = "Block ID list is empty";
    iVar1 = 0x11a;
    goto LAB_0012af38;
  }
  local_38 = httpResponse;
  handle = STRING_construct("<?xml version=\"1.0\" encoding=\"utf-8\"?>\r\n<BlockList>");
  if (handle == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"createBlockIdListXml",0x25,1,"failed opening Block ID List XML");
    }
  }
  else {
    local_40 = httpStatus;
    for (pLVar4 = singlylinkedlist_get_head_item(blockIDList); pLVar4 != (LIST_ITEM_HANDLE)0x0;
        pLVar4 = singlylinkedlist_get_next_item(pLVar4)) {
      pSVar5 = (STRING_HANDLE)singlylinkedlist_item_get_value(pLVar4);
      iVar1 = STRING_concat(handle,"<Latest>");
      if (((iVar1 != 0) || (iVar1 = STRING_concat_with_STRING(handle,pSVar5), iVar1 != 0)) ||
         (iVar1 = STRING_concat(handle,"</Latest>"), iVar1 != 0)) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012aed1;
        pcVar7 = "failed to concatenate Block ID to XML";
        iVar1 = 0x35;
        goto LAB_0012aec5;
      }
    }
    iVar1 = STRING_concat(handle,"</BlockList>");
    if (iVar1 == 0) {
      pSVar5 = STRING_construct(relativePath);
      if (pSVar5 == (STRING_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          BVar6 = BLOB_ERROR;
        }
        else {
          BVar6 = BLOB_ERROR;
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                    ,"Blob_PutBlockList",0x12d,1,"failed to STRING_construct");
        }
        goto LAB_0012b172;
      }
      iVar1 = STRING_concat(pSVar5,"&comp=blocklist");
      if (iVar1 == 0) {
        source = (uchar *)STRING_c_str(handle);
        size = STRING_length(handle);
        requestContent = BUFFER_create(source,size);
        if (requestContent == (BUFFER_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012b111;
          pcVar7 = "failed to BUFFER_create";
          iVar1 = 0x13f;
          goto LAB_0012afec;
        }
        httpResponseStatusCode = 0;
        pcVar7 = STRING_c_str(pSVar5);
        BVar6 = BLOB_HTTP_ERROR;
        HVar2 = HTTPAPIEX_ExecuteRequest
                          (httpApiExHandle,HTTPAPI_REQUEST_PUT,pcVar7,(HTTP_HEADERS_HANDLE)0x0,
                           requestContent,&httpResponseStatusCode,(HTTP_HEADERS_HANDLE)0x0,local_38)
        ;
        if ((HVar2 == HTTPAPIEX_OK) && (httpResponseStatusCode - 100 < 200)) {
          BVar6 = BLOB_OK;
          singlylinkedlist_remove_if(blockIDList,removeAndDestroyBlockIdInList,(void *)0x0);
          puVar8 = local_40;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          puVar8 = local_40;
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                      ,"Blob_PutBlockList",0x151,1,
                      "unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)",
                      (ulong)httpResponseStatusCode);
          }
        }
        *puVar8 = httpResponseStatusCode;
        BUFFER_delete(requestContent);
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
LAB_0012b111:
          BVar6 = BLOB_ERROR;
        }
        else {
          pcVar7 = "failed to STRING_concat";
          iVar1 = 0x134;
LAB_0012afec:
          BVar6 = BLOB_ERROR;
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                    ,"Blob_PutBlockList",iVar1,1,pcVar7);
        }
      }
      STRING_delete(pSVar5);
LAB_0012b172:
      STRING_delete(handle);
      return BVar6;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar7 = "failed closing Block ID List XML";
      iVar1 = 0x41;
LAB_0012aec5:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"createBlockIdListXml",iVar1,1,pcVar7);
    }
LAB_0012aed1:
    STRING_delete(handle);
  }
  p_Var3 = xlogging_get_log_function();
  if (p_Var3 == (LOGGER_LOG)0x0) {
    return BLOB_ERROR;
  }
  pcVar7 = "failed creating Block ID list XML";
  iVar1 = 0x124;
LAB_0012af38:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
            ,"Blob_PutBlockList",iVar1,1,pcVar7);
  return BLOB_ERROR;
}

Assistant:

BLOB_RESULT Blob_PutBlockList(
    HTTPAPIEX_HANDLE httpApiExHandle,
    const char* relativePath,
    SINGLYLINKEDLIST_HANDLE blockIDList,
    unsigned int* httpStatus,
    BUFFER_HANDLE httpResponse)
{
    BLOB_RESULT result;

    if (httpApiExHandle == NULL || relativePath == NULL || blockIDList == NULL || httpStatus == NULL)
    {
        LogError("Invalid argument (httpApiExHandle=%p, relativePath=%p, blockIDList=%p, httpStatus=%p)",
            httpApiExHandle, relativePath, blockIDList, httpStatus);
            result = BLOB_INVALID_ARG;
    }
    else if (singlylinkedlist_get_head_item(blockIDList) == NULL)
    {
        // Block ID List is empty, there is nothing to be be sent to Azure Blob Storage.
        // In this case we better return error, forcing the caller to call this function only
        // if at least one call to Blob_PutBlock() succeeds.
        LogError("Block ID list is empty");
        result = BLOB_ERROR;
    }
    else
    {
        STRING_HANDLE blockIdListXml = createBlockIdListXml(blockIDList);
        
        /*complete the XML*/
        if (blockIdListXml == NULL)
        {
            LogError("failed creating Block ID list XML");
            result = BLOB_ERROR;
        }
        else
        {
            STRING_HANDLE newRelativePath = STRING_construct(relativePath);

            if (newRelativePath == NULL)
            {
                LogError("failed to STRING_construct");
                result = BLOB_ERROR;
            }
            else
            {
                if (STRING_concat(newRelativePath, blockListUriMarker) != 0)
                {
                    LogError("failed to STRING_concat");
                    result = BLOB_ERROR;
                }
                else
                {
                    const char* blockIdListXmlCharPtr = STRING_c_str(blockIdListXml);
                    size_t blockIdListXmlLength = STRING_length(blockIdListXml);
                    BUFFER_HANDLE blockIDListAsBuffer = BUFFER_create((const unsigned char*)blockIdListXmlCharPtr, blockIdListXmlLength);

                    if (blockIDListAsBuffer == NULL)
                    {
                        LogError("failed to BUFFER_create");
                        result = BLOB_ERROR;
                    }
                    else
                    {
                        unsigned int httpResponseStatusCode = 0;

                        if (HTTPAPIEX_ExecuteRequest(
                                httpApiExHandle,
                                HTTPAPI_REQUEST_PUT,
                                STRING_c_str(newRelativePath),
                                NULL,
                                blockIDListAsBuffer,
                                &httpResponseStatusCode,
                                NULL,
                                httpResponse) != HTTPAPIEX_OK ||
                                !IS_HTTP_STATUS_CODE_SUCCESS(httpResponseStatusCode))
                        {
                            LogError("unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)", httpResponseStatusCode);
                            result = BLOB_HTTP_ERROR;
                        }
                        else
                        {
                            (void)singlylinkedlist_remove_if(blockIDList, removeAndDestroyBlockIdInList, NULL);
                            result = BLOB_OK;
                        }

                        if (httpStatus != NULL)
                        {
                            *httpStatus = httpResponseStatusCode;
                        }
                        
                        BUFFER_delete(blockIDListAsBuffer);
                    }
                }
                STRING_delete(newRelativePath);
            }

            STRING_delete(blockIdListXml);
        }
    }

    return result;
}